

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall slang::parsing::Lexer::scanLineComment(Lexer *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int unused2;
  uint32_t unused1;
  TriviaKind local_34 [4];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  bVar2 = tryApplyCommentHandler(this);
  if (bVar2) {
    addTrivia(this,DisabledText);
    return;
  }
  bVar2 = false;
  do {
    while( true ) {
      pcVar4 = this->sourceBuffer;
      cVar1 = *pcVar4;
      if (-1 < cVar1) break;
      bVar3 = scanUTF8Char(this,bVar2,(uint32_t *)&local_30,(int *)local_34);
      bVar2 = (bool)(bVar2 | !bVar3);
    }
    if (cVar1 == '\0') {
      if (this->sourceEnd + -1 <= pcVar4) {
LAB_004138d4:
        local_34[0] = LineComment;
        local_30._M_str = this->marker;
        local_30._M_len = (size_t)(uint)((int)pcVar4 - (int)local_30._M_str);
        SmallVectorBase<slang::parsing::Trivia>::
        emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
                  (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,local_34,
                   &local_30);
        return;
      }
      this->errorCount = this->errorCount + 1;
      Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                       (SourceLocation)
                       (((long)pcVar4 - (long)this->originalBegin) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
      pcVar4 = this->sourceBuffer;
    }
    else if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_004138d4;
    this->sourceBuffer = pcVar4 + 1;
    bVar2 = false;
  } while( true );
}

Assistant:

void Lexer::scanLineComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            if (isNewline(c))
                break;

            sawUTF8Error = false;
            if (c == '\0') {
                if (reallyAtEnd())
                    break;

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
            }
            advance();
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::LineComment);
}